

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

void add_keylist_command(nh_cmd_desc *cmd,nh_menuitem *item,wchar_t id)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nh_menuitem *_item_;
  wchar_t kl;
  wchar_t i;
  char keys [256];
  char buf [256];
  wchar_t id_local;
  nh_menuitem *item_local;
  nh_cmd_desc *cmd_local;
  
  kl._0_1_ = 0;
  for (_item_._4_4_ = L'\0'; _item_._4_4_ < L'ǿ'; _item_._4_4_ = _item_._4_4_ + L'\x01') {
    if (keymap[_item_._4_4_] == cmd) {
      sVar2 = strlen((char *)&kl);
      iVar1 = (int)sVar2;
      _item_._0_4_ = iVar1;
      if (iVar1 != 0) {
        _item_._0_4_ = iVar1 + 1;
        *(undefined1 *)((long)&kl + (long)iVar1) = 0x20;
        *(undefined1 *)((long)&kl + (long)(int)_item_) = 0;
      }
      pcVar3 = curses_keyname(_item_._4_4_);
      strncat((char *)&kl,pcVar3,(long)(0xff - (int)_item_));
      keys[0xf7] = '\0';
    }
  }
  pcVar3 = "";
  if ((cmd->flags & 0x400) != 0) {
    pcVar3 = "#";
  }
  sprintf(keys + 0xf8,"%s%.15s\t%.50s\t%.16s",pcVar3,cmd,cmd->desc,&kl);
  item->id = id;
  item->role = MI_NORMAL;
  item->accel = '\0';
  item->group_accel = '\0';
  item->selected = '\0';
  strcpy(item->caption,keys + 0xf8);
  return;
}

Assistant:

static void add_keylist_command(struct nh_cmd_desc *cmd,
				struct nh_menuitem *item, int id)
{
    char buf[BUFSZ];
    char keys[BUFSZ];
    int i, kl;
    
    keys[0] = '\0';
    for (i = 0; i < KEY_MAX; i++) {
	if (keymap[i] == cmd) {
	    kl = strlen(keys);
	    if (kl) {
		keys[kl++] = ' ';
		keys[kl] = '\0';
	    }
	    strncat(keys, curses_keyname(i), BUFSZ - kl - 1);
	    keys[BUFSZ-1] = '\0';
	}
    }
    
    sprintf(buf, "%s%.15s\t%.50s\t%.16s", cmd->flags & CMD_EXT ? "#" : "",
	    cmd->name, cmd->desc, keys);
    set_menuitem(item, id, MI_NORMAL, buf, 0, FALSE);
}